

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O1

TCGReg tcg_reg_alloc(TCGContext_conflict9 *s,TCGRegSet required_regs,TCGRegSet allocated_regs,
                    TCGRegSet preferred_regs,_Bool rev)

{
  uint uVar1;
  TCGReg extraout_EAX;
  ulong in_RAX;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  undefined7 in_register_00000081;
  int *piVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  TCGRegSet reg_ct [2];
  uint local_48 [2];
  int *local_40;
  ulong local_38;
  
  local_48[1] = ~allocated_regs & required_regs;
  local_48[0] = preferred_regs & local_48[1];
  if ((int)CONCAT71(in_register_00000081,rev) == 0) {
    piVar5 = tcg_target_reg_alloc_order;
  }
  else {
    piVar5 = s->indirect_reg_alloc_order;
  }
  uVar7 = (ulong)(local_48[0] == local_48[1]);
  uVar6 = (ulong)(local_48[0] == 0);
  uVar2 = uVar6;
  if (uVar6 < uVar7) {
    uVar2 = uVar7;
  }
  while( true ) {
    uVar1 = local_48[uVar2];
    if ((uVar1 & uVar1 - 1) == 0) {
      if (uVar1 == 0) {
        uVar3 = 0x20;
      }
      else {
        uVar3 = 0;
        if (uVar1 != 0) {
          for (; (uVar1 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
          }
        }
      }
      bVar8 = s->reg_to_temp[uVar3] != (TCGTemp *)0x0;
      in_RAX = in_RAX & 0xffffffff;
      if (!bVar8) {
        in_RAX = (ulong)uVar3;
      }
    }
    else {
      lVar4 = 0;
      do {
        uVar3 = piVar5[lVar4];
        if ((s->reg_to_temp[uVar3] == (TCGTemp *)0x0) && ((uVar1 >> (uVar3 & 0x1f) & 1) != 0)) {
          bVar8 = false;
          in_RAX = (ulong)uVar3;
        }
        else {
          bVar8 = true;
        }
      } while ((bVar8) && (bVar9 = lVar4 != 0x1e, lVar4 = lVar4 + 1, bVar9));
    }
    if (!bVar8) break;
    bVar8 = uVar2 != 0;
    uVar2 = uVar2 + 1;
    if (bVar8) {
      if (uVar6 < uVar7) {
        uVar6 = uVar7;
      }
      local_40 = piVar5;
      while( true ) {
        local_38 = uVar6;
        uVar1 = local_48[uVar6];
        if ((uVar1 & uVar1 - 1) == 0) {
          if (uVar1 == 0) {
            in_RAX = 0x20;
          }
          else {
            uVar3 = 0;
            if (uVar1 != 0) {
              for (; (uVar1 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
              }
            }
            in_RAX = (ulong)uVar3;
          }
          bVar8 = false;
          if (s->reg_to_temp[in_RAX] != (TCGTemp *)0x0) {
            temp_sync(s,s->reg_to_temp[in_RAX],allocated_regs,0,-1);
            piVar5 = local_40;
            bVar8 = false;
          }
        }
        else {
          lVar4 = 0;
          do {
            uVar3 = piVar5[lVar4];
            uVar6 = (ulong)uVar3;
            bVar8 = (uVar1 >> (uVar3 & 0x1f) & 1) == 0;
            if ((!bVar8) && (in_RAX = uVar6, s->reg_to_temp[uVar6] != (TCGTemp *)0x0)) {
              temp_sync(s,s->reg_to_temp[uVar6],allocated_regs,0,-1);
              piVar5 = local_40;
            }
          } while (((1 << ((byte)uVar3 & 0x1f) & uVar1) == 0) &&
                  (bVar9 = lVar4 != 0x1e, lVar4 = lVar4 + 1, bVar9));
        }
        if (!bVar8) break;
        uVar6 = local_38 + 1;
        if (local_38 != 0) {
          tcg_reg_alloc_cold_1();
          return extraout_EAX;
        }
      }
      return (TCGReg)in_RAX;
    }
  }
  return (TCGReg)in_RAX;
}

Assistant:

static TCGReg tcg_reg_alloc(TCGContext *s, TCGRegSet required_regs,
                            TCGRegSet allocated_regs,
                            TCGRegSet preferred_regs, bool rev)
{
    int i, j, f, n = ARRAY_SIZE(tcg_target_reg_alloc_order);
    TCGRegSet reg_ct[2];
    const int *order;

    reg_ct[1] = required_regs & ~allocated_regs;
    tcg_debug_assert(reg_ct[1] != 0);
    reg_ct[0] = reg_ct[1] & preferred_regs;

    /* Skip the preferred_regs option if it cannot be satisfied,
       or if the preference made no difference.  */
    f = reg_ct[0] == 0 || reg_ct[0] == reg_ct[1];

    order = rev ? s->indirect_reg_alloc_order : tcg_target_reg_alloc_order;

    /* Try free registers, preferences first.  */
    for (j = f; j < 2; j++) {
        TCGRegSet set = reg_ct[j];

        if (tcg_regset_single(set)) {
            /* One register in the set.  */
            TCGReg reg = tcg_regset_first(set);
            if (s->reg_to_temp[reg] == NULL) {
                return reg;
            }
        } else {
            for (i = 0; i < n; i++) {
                TCGReg reg = order[i];
                if (s->reg_to_temp[reg] == NULL &&
                    tcg_regset_test_reg(set, reg)) {
                    return reg;
                }
            }
        }
    }

    /* We must spill something.  */
    for (j = f; j < 2; j++) {
        TCGRegSet set = reg_ct[j];

        if (tcg_regset_single(set)) {
            /* One register in the set.  */
            TCGReg reg = tcg_regset_first(set);
            tcg_reg_free(s, reg, allocated_regs);
            return reg;
        } else {
            for (i = 0; i < n; i++) {
                TCGReg reg = order[i];
                if (tcg_regset_test_reg(set, reg)) {
                    tcg_reg_free(s, reg, allocated_regs);
                    return reg;
                }
            }
        }
    }

    tcg_abort();
}